

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O1

uint * Raig_ManSimRef(Raig_Man_t *p,int i)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  size_t __size;
  uint uVar7;
  
  if (i < 2) {
    __assert_fail("i > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                  ,0xe6,"unsigned int *Raig_ManSimRef(Raig_Man_t *, int)");
  }
  if (p->pSims[(uint)i] == 0) {
    if (p->MemFree == 0) {
      if (p->nWordsAlloc == 0) {
        if (p->pMems != (uint *)0x0) {
          __assert_fail("p->pMems == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                        ,0xed,"unsigned int *Raig_ManSimRef(Raig_Man_t *, int)");
        }
        p->nWordsAlloc = 0x20000;
        p->nMems = 1;
      }
      iVar2 = p->nWordsAlloc;
      p->nWordsAlloc = iVar2 * 2;
      __size = (long)iVar2 << 3;
      if (p->pMems == (uint *)0x0) {
        puVar4 = (uint *)malloc(__size);
      }
      else {
        puVar4 = (uint *)realloc(p->pMems,__size);
      }
      piVar1 = &p->MemFree;
      p->pMems = puVar4;
      iVar2 = p->nWords;
      memset(puVar4,0xff,(long)iVar2 * 4 + 4);
      uVar7 = (iVar2 + 1) * p->nMems;
      iVar2 = p->nWords;
      uVar3 = p->nWordsAlloc;
      uVar5 = iVar2 + uVar7 + 1;
      while (uVar5 < uVar3) {
        *piVar1 = uVar7;
        piVar1 = (int *)(puVar4 + uVar7);
        iVar6 = uVar7 + iVar2 * 2;
        uVar7 = uVar7 + iVar2 + 1;
        uVar5 = iVar6 + 2;
      }
      *piVar1 = 0;
    }
    p->pSims[(uint)i] = p->MemFree;
    puVar4 = p->pMems + p->MemFree;
    p->MemFree = *puVar4;
    *puVar4 = p->pRefs[(uint)i];
    iVar6 = p->nMems;
    iVar2 = iVar6 + 1;
    p->nMems = iVar2;
    if (p->nMemsMax <= iVar6) {
      p->nMemsMax = iVar2;
    }
    return puVar4;
  }
  __assert_fail("p->pSims[i] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                ,0xe7,"unsigned int *Raig_ManSimRef(Raig_Man_t *, int)");
}

Assistant:

unsigned * Raig_ManSimRef( Raig_Man_t * p, int i )
{
    unsigned * pSim;
    assert( i > 1 );
    assert( p->pSims[i] == 0 );
    if ( p->MemFree == 0 )
    {
        unsigned * pPlace, Ent;
        if ( p->nWordsAlloc == 0 )
        {
            assert( p->pMems == NULL );
            p->nWordsAlloc = (1<<17); // -> 1Mb
            p->nMems = 1;
        }
        p->nWordsAlloc *= 2;
        p->pMems = ABC_REALLOC( unsigned, p->pMems, p->nWordsAlloc );
        memset( p->pMems, 0xff, sizeof(unsigned) * (p->nWords + 1) );
        pPlace = (unsigned *)&p->MemFree;
        for ( Ent = p->nMems * (p->nWords + 1); 
              Ent + p->nWords + 1 < (unsigned)p->nWordsAlloc; 
              Ent += p->nWords + 1 )
        {
            *pPlace = Ent;
            pPlace = p->pMems + Ent;
        }
        *pPlace = 0;
    }
    p->pSims[i] = p->MemFree;
    pSim = p->pMems + p->MemFree;
    p->MemFree = pSim[0];
    pSim[0] = p->pRefs[i];
    p->nMems++;
    if ( p->nMemsMax < p->nMems )
        p->nMemsMax = p->nMems;
    return pSim;
}